

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

void callhook(lua_State *L,int event,BCLine line)

{
  code *pcVar1;
  ulong uVar2;
  lua_Debug ar;
  int local_90 [10];
  BCLine local_68;
  undefined4 local_1c;
  
  uVar2 = (ulong)(L->glref).ptr32;
  pcVar1 = *(code **)(uVar2 + 0xd0);
  if ((pcVar1 != (code *)0x0) && ((*(byte *)(uVar2 + 0x91) & 0x10) == 0)) {
    *(byte *)(uVar2 + 0x254) = *(byte *)(uVar2 + 0x254) & 0xef;
    local_1c = (undefined4)((long)L->base + (-8 - (ulong)(L->stack).ptr32) >> 3);
    local_90[0] = event;
    local_68 = line;
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) < 0xa9) {
      lj_state_growstack(L,0x15);
    }
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) | 0x10;
    (*pcVar1)(L,local_90);
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xef;
  }
  return;
}

Assistant:

static void callhook(lua_State *L, int event, BCLine line)
{
  global_State *g = G(L);
  lua_Hook hookf = g->hookf;
  if (hookf && !hook_active(g)) {
    lua_Debug ar;
    lj_trace_abort(g);  /* Abort recording on any hook call. */
    ar.event = event;
    ar.currentline = line;
    /* Top frame, nextframe = NULL. */
    ar.i_ci = (int)((L->base-1) - tvref(L->stack));
    lj_state_checkstack(L, 1+LUA_MINSTACK);
    hook_enter(g);
    hookf(L, &ar);
    lua_assert(hook_active(g));
    hook_leave(g);
  }
}